

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::Descriptor::GetLocationPath
          (Descriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int iVar1;
  undefined8 in_RAX;
  long *plVar2;
  int *__args;
  iterator iVar3;
  undefined8 local_18;
  
  __args = (int *)&local_18;
  local_18 = in_RAX;
  if (*(Descriptor **)(this + 0x18) == (Descriptor *)0x0) {
    iVar3._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)output,iVar3,
                 &FileDescriptorProto::kMessageTypeFieldNumber);
    }
    else {
      *iVar3._M_current = 4;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
    plVar2 = (long *)(*(long *)(this + 0x18) + 0x40);
    if (*(long *)(this + 0x18) == 0) {
      plVar2 = (long *)(*(long *)(this + 0x10) + 0x50);
    }
    iVar1 = (int)((ulong)((long)this - *plVar2) >> 3) * -0x11111111;
    local_18 = CONCAT44(local_18._4_4_,iVar1);
    iVar3._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current !=
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_0017a453;
  }
  else {
    GetLocationPath(*(Descriptor **)(this + 0x18),output);
    iVar3._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)output,iVar3,
                 &DescriptorProto::kNestedTypeFieldNumber);
    }
    else {
      *iVar3._M_current = 3;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
    plVar2 = (long *)(*(long *)(this + 0x18) + 0x40);
    if (*(long *)(this + 0x18) == 0) {
      plVar2 = (long *)(*(long *)(this + 0x10) + 0x50);
    }
    iVar1 = (int)((ulong)((long)this - *plVar2) >> 3) * -0x11111111;
    local_18 = CONCAT44(iVar1,(int)local_18);
    iVar3._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current !=
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
LAB_0017a453:
      *iVar3._M_current = iVar1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
      return;
    }
    __args = (int *)((long)&local_18 + 4);
  }
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar3,__args);
  return;
}

Assistant:

void Descriptor::GetLocationPath(vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kNestedTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kMessageTypeFieldNumber);
    output->push_back(index());
  }
}